

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  char *pcVar7;
  ulong *puVar8;
  size_type *psVar9;
  ulong uVar10;
  ulong uVar11;
  string subs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + value->_M_string_length);
  if ((anonymous_namespace)::g_globalRunContext != (long *)0x0) {
    plVar5 = (long *)(**(code **)(*(anonymous_namespace)::g_globalRunContext + 0x60))();
    cVar4 = (**(code **)(*plVar5 + 0x58))(plVar5);
    if ((cVar4 != '\0') && (local_b0._M_string_length != 0)) {
      paVar1 = &local_f0.field_2;
      uVar11 = 0;
      do {
        local_f0._M_string_length = 0;
        local_f0.field_2._M_local_buf[0] = '\0';
        cVar4 = local_b0._M_dataplus._M_p[uVar11];
        local_f0._M_dataplus._M_p = (pointer)paVar1;
        if (cVar4 == '\t') {
          pcVar7 = "\\t";
LAB_0012ef86:
          std::__cxx11::string::_M_replace((ulong)&local_f0,0,(char *)0x0,(ulong)pcVar7);
          if (local_f0._M_string_length != 0) {
            std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b0);
            plVar5 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_50,(ulong)local_f0._M_dataplus._M_p);
            puVar8 = (ulong *)(plVar5 + 2);
            if ((ulong *)*plVar5 == puVar8) {
              local_80 = *puVar8;
              lStack_78 = plVar5[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *puVar8;
              local_90 = (ulong *)*plVar5;
            }
            local_88 = plVar5[1];
            *plVar5 = (long)puVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            uVar11 = uVar11 + 1;
            std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_b0);
            uVar10 = 0xf;
            if (local_90 != &local_80) {
              uVar10 = local_80;
            }
            if (uVar10 < (ulong)(local_68 + local_88)) {
              uVar10 = 0xf;
              if (local_70 != local_60) {
                uVar10 = local_60[0];
              }
              if (uVar10 < (ulong)(local_68 + local_88)) goto LAB_0012f080;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90)
              ;
            }
            else {
LAB_0012f080:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
            }
            local_d0 = &local_c0;
            plVar5 = puVar6 + 2;
            if ((long *)*puVar6 == plVar5) {
              local_c0 = *plVar5;
              uStack_b8 = puVar6[3];
            }
            else {
              local_c0 = *plVar5;
              local_d0 = (long *)*puVar6;
            }
            local_c8 = puVar6[1];
            *puVar6 = plVar5;
            puVar6[1] = 0;
            *(undefined1 *)plVar5 = 0;
            std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,local_c0 + 1);
            }
            if (local_70 != local_60) {
              operator_delete(local_70,local_60[0] + 1);
            }
            if (local_90 != &local_80) {
              operator_delete(local_90,local_80 + 1);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
        }
        else {
          if (cVar4 == '\n') {
            pcVar7 = "\\n";
            goto LAB_0012ef86;
          }
          pcVar7 = "\\r";
          if (cVar4 == '\r') goto LAB_0012ef86;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0._M_dataplus._M_p,
                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                   local_f0.field_2._M_local_buf[0]) + 1);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < local_b0._M_string_length);
    }
  }
  std::operator+(&local_f0,"\"",&local_b0);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    IConfig const* config = getGlobalConfig();
    if( config && config->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\r': subs = "\\r"; break;
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}